

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelBufferDataStoreCase::checkTextureState
          (TextureLevelBufferDataStoreCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  bool bVar1;
  bool local_21;
  bool allOk;
  TextureGenerationSpec *spec_local;
  CallLogWrapper *gl_local;
  TextureLevelBufferDataStoreCase *this_local;
  
  bVar1 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
          ::empty(&spec->levels);
  if (bVar1) {
    local_21 = verifyTextureLevelParameterEqual
                         (gl,spec->queryTarget,0,0x8c2d,0,(this->super_TextureLevelCase).m_type);
  }
  else {
    local_21 = verifyTextureLevelParameterEqual
                         (gl,spec->queryTarget,0,0x8c2d,(this->super_TextureLevelCase).m_texBuffer,
                          (this->super_TextureLevelCase).m_type);
  }
  return local_21;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		bool allOk = true;

		if (spec.levels.empty())
		{
			allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, 0, GL_TEXTURE_BUFFER_DATA_STORE_BINDING, 0, m_type);
		}
		else
		{
			allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, 0, GL_TEXTURE_BUFFER_DATA_STORE_BINDING, m_texBuffer, m_type);
		}

		return allOk;
	}